

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

wstring * __thiscall
mjs::property_name_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,expression *e)

{
  bool bVar1;
  int iVar2;
  mjs *this_00;
  token *this_01;
  double m;
  
  this_00 = this;
  bVar1 = is_valid_property_name_expression((expression *)this);
  if (!bVar1) {
    __assert_fail("is_valid_property_name_expression(e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x95,"std::wstring mjs::property_name_string(const expression &)");
  }
  iVar2 = (**(code **)(*(long *)this + 0x18))(this);
  this_01 = (token *)(this + 0x20);
  if (iVar2 != 0) {
    if (this_01->type_ == numeric_literal) {
      m = token::dvalue(this_01);
      number_to_string_abi_cxx11_(__return_storage_ptr__,this_00,m);
      return __return_storage_ptr__;
    }
    if (this_01->type_ != string_literal) {
      __assert_fail("lt.type() == token_type::numeric_literal",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x9d,"std::wstring mjs::property_name_string(const expression &)");
    }
    this_01 = (token *)token::text_abi_cxx11_(this_01);
  }
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::wstring property_name_string(const expression& e) {
    assert(is_valid_property_name_expression(e));
    if (e.type() == expression_type::identifier) {
        return static_cast<const identifier_expression&>(e).id();
    }
    const auto& lt = static_cast<const literal_expression&>(e).t();
    if (lt.type() == token_type::string_literal) {
        return lt.text();
    } else {
        assert(lt.type() == token_type::numeric_literal);
        return number_to_string(lt.dvalue());
    }
}